

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

int AF_APlayerPawn_ResetAirSupply
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  APlayerPawn *this;
  bool bVar5;
  PClass *pPVar3;
  
  pPVar1 = APlayerPawn::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0046beb4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0046bea4:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0046beb4:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x503,
                  "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (APlayerPawn *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (APlayerPawn *)0x0) goto LAB_0046be38;
    pPVar3 = (this->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_AActor).super_DThinker.super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(APlayerPawn))";
      goto LAB_0046beb4;
    }
  }
  else {
    if (this != (APlayerPawn *)0x0) goto LAB_0046bea4;
LAB_0046be38:
    this = (APlayerPawn *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_0046be62:
      bVar5 = APlayerPawn::ResetAirSupply(this,param[1].field_0.i != 0);
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x505,
                        "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(uint *)ret->Location = (uint)bVar5;
        iVar2 = 1;
      }
      return iVar2;
    }
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_0046be62;
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x504,
                "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(APlayerPawn, ResetAirSupply)
{
	PARAM_SELF_PROLOGUE(APlayerPawn);
	PARAM_BOOL_DEF(playgasp);
	ACTION_RETURN_BOOL(self->ResetAirSupply(playgasp));
}